

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalCompare(Parser *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  runtime_error *prVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  Expression *__tmp;
  BinaryOpExpr *this_01;
  Parser *in_RSI;
  Op o;
  string *this_02;
  bool bVar8;
  undefined1 auVar9 [16];
  shared_ptr<minja::Expression> sVar10;
  shared_ptr<minja::VariableExpr> identifier;
  shared_ptr<minja::Expression> left;
  shared_ptr<minja::Expression> right;
  string op_str;
  undefined1 local_a9;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _func_int **local_38;
  
  local_78._16_8_ = this;
  parseStringConcat((Parser *)(local_98 + 0x10));
  if ((BinaryOpExpr *)local_98._16_8_ == (BinaryOpExpr *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Expected left side of \'logical compare\' expression")
    ;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseLogicalCompare()::compare_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseLogicalCompare()::compare_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parseLogicalCompare()::compare_tok_abi_cxx11_,
               "==|!=|<=?|>=?|in\\b|is\\b|not\\s+in\\b",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseLogicalCompare()::compare_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseLogicalCompare()::compare_tok_abi_cxx11_);
  }
  if ((parseLogicalCompare()::not_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseLogicalCompare()::not_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parseLogicalCompare()::not_tok_abi_cxx11_,"not\\b",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseLogicalCompare()::not_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseLogicalCompare()::not_tok_abi_cxx11_);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00265f20;
  do {
    this_02 = (string *)(local_78 + 0x20);
    consumeToken((string *)local_a8,in_RSI,&parseLogicalCompare()::compare_tok_abi_cxx11_,Strip);
    auVar9 = std::__cxx11::string::operator=(this_02,(string *)local_a8);
    _Var7._M_pi = auVar9._8_8_;
    lVar1 = *(long *)(auVar9._0_8_ + 8);
    if ((element_type *)local_a8._0_8_ != (element_type *)local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
      _Var7._M_pi = extraout_RDX;
    }
    uVar2 = local_98._24_8_;
    if (lVar1 == 0) {
      local_98._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined8 *)local_78._16_8_ = local_98._16_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78._16_8_ + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      local_98._16_8_ = (BinaryOpExpr *)0x0;
      break;
    }
    this_00 = (in_RSI->template_str).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)this_02);
    if (iVar3 == 0) {
      consumeToken((string *)local_a8,in_RSI,&parseLogicalCompare()::not_tok_abi_cxx11_,Strip);
      uVar2 = local_a8._8_8_;
      if ((element_type *)local_a8._0_8_ != (element_type *)local_98) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
      }
      parseIdentifier((Parser *)local_a8);
      if ((element_type *)local_a8._0_8_ == (element_type *)0x0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Expected identifier after \'is\' keyword");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_78._28_4_ =
           0x13 - (uint)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 ==
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      local_78._0_8_ = (BinaryOpExpr *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<minja::BinaryOpExpr,std::allocator<minja::BinaryOpExpr>,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::VariableExpr>,minja::BinaryOpExpr::Op>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
                 (BinaryOpExpr **)local_78,(allocator<minja::BinaryOpExpr> *)&local_a9,
                 (Location *)(local_98._16_8_ + 8),
                 (shared_ptr<minja::Expression> *)(local_98 + 0x10),
                 (shared_ptr<minja::VariableExpr> *)local_a8,(Op *)(local_78 + 0x1c));
      *(undefined8 *)local_78._16_8_ = local_78._0_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78._16_8_ + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      _Var7._M_pi = extraout_RDX_00;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
    }
    else {
      parseStringConcat((Parser *)local_78);
      if ((BinaryOpExpr *)local_78._0_8_ == (BinaryOpExpr *)0x0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar6,"Expected right side of \'logical compare\' expression");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar4 = std::__cxx11::string::compare((char *)this_02);
      if (iVar4 == 0) {
        o = Eq;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)this_02);
        if (iVar4 == 0) {
          o = Ne;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)this_02);
          if (iVar4 == 0) {
            o = Lt;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)this_02);
            if (iVar4 == 0) {
              o = Gt;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)this_02);
              if (iVar4 == 0) {
                o = Le;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)this_02);
                if (iVar4 == 0) {
                  o = Ge;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)this_02);
                  if (iVar4 == 0) {
                    o = In;
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_a8,(ulong)this_02);
                    iVar4 = std::__cxx11::string::compare((char *)local_a8);
                    if ((element_type *)local_a8._0_8_ != (element_type *)local_98) {
                      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
                    }
                    o = NotIn;
                    if (iVar4 != 0) {
                      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a8,"Unknown comparison operator: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_78 + 0x20));
                      std::runtime_error::runtime_error(prVar6,(string *)local_a8);
                      __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_a8._0_8_ =
           (in_RSI->template_str).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_a8._8_8_ =
           (in_RSI->template_str).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
        }
      }
      local_98._0_8_ = (in_RSI->it)._M_current + -(long)(in_RSI->start)._M_current;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = local_38;
      this_01 = (BinaryOpExpr *)(p_Var5 + 1);
      BinaryOpExpr::BinaryOpExpr
                (this_01,(Location *)local_a8,(shared_ptr<minja::Expression> *)(local_98 + 0x10),
                 (shared_ptr<minja::Expression> *)local_78,o);
      uVar2 = local_98._24_8_;
      bVar8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var7._M_pi = extraout_RDX_01;
      local_98._16_8_ = this_01;
      local_98._24_8_ = p_Var5;
      if (bVar8) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        _Var7._M_pi = extraout_RDX_02;
      }
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        _Var7._M_pi = extraout_RDX_03;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      }
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      _Var7._M_pi = extraout_RDX_04;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var7._M_pi = extraout_RDX_05;
    }
  } while (iVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
    _Var7._M_pi = extraout_RDX_06;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_);
    _Var7._M_pi = extraout_RDX_07;
  }
  sVar10.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar10.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._16_8_;
  return (shared_ptr<minja::Expression>)
         sVar10.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseLogicalCompare() {
        auto left = parseStringConcat();
        if (!left) throw std::runtime_error("Expected left side of 'logical compare' expression");

        static std::regex compare_tok(R"(==|!=|<=?|>=?|in\b|is\b|not\s+in\b)");
        static std::regex not_tok(R"(not\b)");
        std::string op_str;
        while (!(op_str = consumeToken(compare_tok)).empty()) {
            auto location = get_location();
            if (op_str == "is") {
              auto negated = !consumeToken(not_tok).empty();

              auto identifier = parseIdentifier();
              if (!identifier) throw std::runtime_error("Expected identifier after 'is' keyword");

              return std::make_shared<BinaryOpExpr>(
                  left->location,
                  std::move(left), std::move(identifier),
                  negated ? BinaryOpExpr::Op::IsNot : BinaryOpExpr::Op::Is);
            }
            auto right = parseStringConcat();
            if (!right) throw std::runtime_error("Expected right side of 'logical compare' expression");
            BinaryOpExpr::Op op;
            if (op_str == "==") op = BinaryOpExpr::Op::Eq;
            else if (op_str == "!=") op = BinaryOpExpr::Op::Ne;
            else if (op_str == "<") op = BinaryOpExpr::Op::Lt;
            else if (op_str == ">") op = BinaryOpExpr::Op::Gt;
            else if (op_str == "<=") op = BinaryOpExpr::Op::Le;
            else if (op_str == ">=") op = BinaryOpExpr::Op::Ge;
            else if (op_str == "in") op = BinaryOpExpr::Op::In;
            else if (op_str.substr(0, 3) == "not") op = BinaryOpExpr::Op::NotIn;
            else throw std::runtime_error("Unknown comparison operator: " + op_str);
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }
        return left;
    }